

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimAnim.cpp
# Opt level: O1

void simanim::createAnimation(path *path,uint64_t frameWidth,uint64_t frameHeight)

{
  char cVar1;
  ostream *poVar2;
  ofstream file;
  path local_270;
  path local_248;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  cVar1 = std::filesystem::status(path);
  if ((cVar1 == -1) || (cVar1 == '\0')) {
    std::filesystem::create_directories(path);
  }
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            (&local_248,(char (*) [9])"time.txt",auto_format);
  std::filesystem::__cxx11::operator/(&local_270,path,&local_248);
  std::ofstream::ofstream(&local_220,local_270._M_pathname._M_dataplus._M_p,_S_out);
  std::filesystem::__cxx11::path::~path(&local_270);
  std::filesystem::__cxx11::path::~path(&local_248);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_220);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ofstream::close();
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void createAnimation(const fs::path& path, uint64_t frameWidth, uint64_t frameHeight)
	{
		if (!fs::exists(path))
			fs::create_directories(path);

		std::ofstream file(path / "time.txt");
		file << frameWidth << " " << frameHeight << std::endl;
		file.close();
	}